

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

bool __thiscall Inline::GetInlineeHasArgumentObject(Inline *this,Func *inlinee)

{
  short sVar1;
  code *pcVar2;
  bool bVar3;
  LocalFunctionId localFuncId;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar4;
  Opnd *this_01;
  RegOpnd *pRVar5;
  AddrOpnd *pAVar6;
  BuiltinFunction local_49;
  Opnd *pOStack_48;
  BuiltinFunction builtinFunction;
  Opnd *builtInOpnd;
  Instr *instr;
  Instr *instrStop;
  Instr *__prevInstrCheck;
  SymID argumentsSymId;
  Func *inlinee_local;
  Inline *this_local;
  
  this_00 = Func::GetJITFunctionBody(inlinee);
  bVar3 = JITTimeFunctionBody::UsesArgumentsObject(this_00);
  if (bVar3) {
    bVar3 = Func::GetApplyTargetInliningRemovedArgumentsAccess(inlinee);
    if (bVar3) {
      __prevInstrCheck._4_4_ = 0;
      instrStop = (Instr *)0x0;
      for (builtInOpnd = (Opnd *)inlinee->m_headInstr; builtInOpnd != (Opnd *)0x0;
          builtInOpnd = (Opnd *)builtInOpnd[1]._vptr_Opnd) {
        if ((instrStop != (Instr *)0x0) && (instrStop->m_next != (Instr *)builtInOpnd)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x16a9,
                             "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                             "Modifying instr list but not using EDITING iterator!");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        instrStop = (Instr *)builtInOpnd;
        if ((Func *)builtInOpnd[2]._vptr_Opnd == inlinee) {
          if ((*(short *)&builtInOpnd[3]._vptr_Opnd == 0xb1) ||
             (*(short *)&builtInOpnd[3]._vptr_Opnd == 0xb2)) {
            this_01 = IR::Instr::GetDst((Instr *)builtInOpnd);
            pRVar5 = IR::Opnd::AsRegOpnd(this_01);
            __prevInstrCheck._4_4_ = (pRVar5->m_sym->super_Sym).m_id;
          }
          else if ((__prevInstrCheck._4_4_ != 0) &&
                  (sVar1 = *(short *)&builtInOpnd[3]._vptr_Opnd, sVar1 != 0x1ee)) {
            if (sVar1 == 0x1f1) {
              bVar3 = GetIsInInlinedApplyCall(this);
              if ((bVar3) &&
                 (bVar3 = HasArgumentsAccess(this,(Instr *)builtInOpnd,__prevInstrCheck._4_4_),
                 bVar3)) {
                return true;
              }
            }
            else if ((sVar1 != 0x233) && (1 < (ushort)(sVar1 - 0x242U))) {
              if (sVar1 == 0x24c) {
                pOStack_48 = IR::Instr::GetSrc1((Instr *)builtInOpnd);
                bVar3 = IR::Opnd::IsAddrOpnd(pOStack_48);
                if (bVar3) {
                  pAVar6 = IR::Opnd::AsAddrOpnd(pOStack_48);
                  if (((byte)pAVar6->field_0x28 >> 1 & 1) == 0) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar4 = 1;
                    bVar3 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                       ,0x16c0,"(builtInOpnd->AsAddrOpnd()->m_isFunction)",
                                       "builtInOpnd->AsAddrOpnd()->m_isFunction");
                    if (!bVar3) {
                      pcVar2 = (code *)invalidInstructionException();
                      (*pcVar2)();
                    }
                    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                    *puVar4 = 0;
                  }
                  pAVar6 = IR::Opnd::AsAddrOpnd(pOStack_48);
                  localFuncId = FixedFieldInfo::GetLocalFuncId((FixedFieldInfo *)pAVar6->m_metadata)
                  ;
                  local_49 = Js::JavascriptLibrary::GetBuiltInForFuncInfo(localFuncId);
                  bVar3 = Js::BuiltinFunction::operator==(&local_49,JavascriptFunction_Apply);
                  if (bVar3) {
                    SetIsInInlinedApplyCall(this,true);
                  }
                }
                else {
                  bVar3 = IR::Opnd::IsRegOpnd(pOStack_48);
                  if (bVar3) {
                    pRVar5 = IR::Opnd::AsRegOpnd(pOStack_48);
                    bVar3 = Js::BuiltinFunction::operator==
                                      (&pRVar5->m_sym->m_builtInIndex,JavascriptFunction_Apply);
                    if (bVar3) {
                      SetIsInInlinedApplyCall(this,true);
                    }
                  }
                }
              }
              else if (sVar1 == 0x24d) {
                bVar3 = GetIsInInlinedApplyCall(this);
                if (bVar3) {
                  SetIsInInlinedApplyCall(this,false);
                }
              }
              else {
                bVar3 = HasArgumentsAccess(this,(Instr *)builtInOpnd,__prevInstrCheck._4_4_);
                if (bVar3) {
                  return true;
                }
              }
            }
          }
        }
      }
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
Inline::GetInlineeHasArgumentObject(Func * inlinee)
{
    if (!inlinee->GetJITFunctionBody()->UsesArgumentsObject())
    {
        // If inlinee has no arguments access return false
        return false;
    }

    // Inlinee has arguments access

    if (!inlinee->GetApplyTargetInliningRemovedArgumentsAccess())
    {
        return true;
    }

    // Its possible there is no more arguments access after we inline apply target; validate the same.
    // This sounds expensive, but we are only walking inlinee which has apply target inlining optimization enabled.
    // Also we walk only instruction in that inlinee and not nested inlinees. So it is not expensive.
    SymID argumentsSymId = 0;
    FOREACH_INSTR_IN_FUNC(instr, inlinee)
    {
        if (instr->m_func != inlinee)
        {
            // Skip nested inlinees
            continue;
        }

        if (instr->m_opcode == Js::OpCode::LdHeapArguments || instr->m_opcode == Js::OpCode::LdLetHeapArguments)
        {
            argumentsSymId = instr->GetDst()->AsRegOpnd()->m_sym->m_id;
        }
        else if (argumentsSymId != 0)
        {
            // Once we find the arguments object i.e. argumentsSymId is set
            // Make sure no one refers to it.
            switch (instr->m_opcode)
            {
                case Js::OpCode::InlineBuiltInStart:
                    {
                        IR::Opnd* builtInOpnd = instr->GetSrc1();
                        if (builtInOpnd->IsAddrOpnd())
                        {
                            Assert(builtInOpnd->AsAddrOpnd()->m_isFunction);

                            Js::BuiltinFunction builtinFunction = Js::JavascriptLibrary::GetBuiltInForFuncInfo(((FixedFieldInfo*)builtInOpnd->AsAddrOpnd()->m_metadata)->GetLocalFuncId());
                            if (builtinFunction == Js::BuiltinFunction::JavascriptFunction_Apply)
                            {
                                this->SetIsInInlinedApplyCall(true);
                            }
                        }
                        else if (builtInOpnd->IsRegOpnd())
                        {
                            if (builtInOpnd->AsRegOpnd()->m_sym->m_builtInIndex == Js::BuiltinFunction::JavascriptFunction_Apply)
                            {
                                this->SetIsInInlinedApplyCall(true);
                            }
                        }
                        break;
                    }

                case Js::OpCode::InlineBuiltInEnd:
                    {
                        if(this->GetIsInInlinedApplyCall())
                        {
                            this->SetIsInInlinedApplyCall(false);
                        }
                        break;
                    }

                case Js::OpCode::BailOnNotStackArgs:
                case Js::OpCode::ArgOut_A_InlineBuiltIn:
                case Js::OpCode::BytecodeArgOutCapture:
                case Js::OpCode::BytecodeArgOutUse:
                    // These are part of arguments optimization and we are fine if they access stack args.
                    break;

                case Js::OpCode::ArgOut_A_FromStackArgs:
                    {
                        // If ArgOut_A_FromStackArgs is part of the call sequence for apply built-in inlining (as opposed to apply target inlining),
                        // then arguments access continues to exist.
                        if (this->GetIsInInlinedApplyCall() && HasArgumentsAccess(instr, argumentsSymId))
                        {
                            return true;
                        }
                        break;
                    }

                default:
                    {
                        if (HasArgumentsAccess(instr, argumentsSymId))
                        {
                            return true;
                        }
                    }
            }
        }
    }
    NEXT_INSTR_IN_FUNC;
    return false;
}